

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fourier_transform.cc
# Opt level: O0

void __thiscall sptk::FourierTransform::FourierTransform(FourierTransform *this,int length)

{
  bool bVar1;
  void *pvVar2;
  int in_ESI;
  undefined8 *in_RDI;
  int fft_length;
  DiscreteFourierTransformWrapper *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__FourierTransform_00129b68;
  bVar1 = IsPowerOfTwo(in_ESI);
  fft_length = (int)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    pvVar2 = operator_new(0x38);
    anon_unknown.dwarf_a9ff::FastFourierTransformWrapper::FastFourierTransformWrapper
              ((FastFourierTransformWrapper *)in_stack_ffffffffffffffe0,fft_length);
    in_RDI[1] = pvVar2;
  }
  else {
    pvVar2 = operator_new(0x48);
    anon_unknown.dwarf_a9ff::DiscreteFourierTransformWrapper::DiscreteFourierTransformWrapper
              (in_stack_ffffffffffffffe0,fft_length);
    in_RDI[1] = pvVar2;
  }
  return;
}

Assistant:

FourierTransform::FourierTransform(int length) {
  if (sptk::IsPowerOfTwo(length)) {
    fourier_transform_ = new FastFourierTransformWrapper(length);
  } else {
    fourier_transform_ = new DiscreteFourierTransformWrapper(length);
  }
}